

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O2

void __thiscall avro::Validator::enumAdvance(Validator *this)

{
  if (this->compoundStarted_ == true) {
    this->count_ = 0;
    this->nextType_ = AVRO_LONG;
    this->expectedTypesFlag_ = 0xc;
    this->compoundStarted_ = false;
    this->waitingForCount_ = true;
    return;
  }
  this->waitingForCount_ = false;
  std::vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>::
  pop_back(&this->compoundStack_);
  return;
}

Assistant:

void
Validator::enumAdvance()
{
    if(compoundStarted_) {
        setWaitingForCount();
        compoundStarted_ = false;
    }
    else {
        waitingForCount_ = false;
        compoundStack_.pop_back();
    }
}